

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

void prsxgen_pia(prscxdef *ctx)

{
  prsndef *ppVar1;
  prsbdef *binctx;
  
  binctx = &prsb_cma_C;
  if ((ctx->prscxtok->tokcxflg & 4) == 0) {
    binctx = &prsb_cma;
  }
  ppVar1 = prsxbin(ctx,binctx);
  ppVar1 = prsfold(ctx,ppVar1);
  if ((((ctx->prscxtok->tokcxflg & 4) != 0) && (ppVar1 != (prsndef *)0x0)) &&
     (ppVar1->prsntyp == 0x9e)) {
    errlogf(ctx->prscxerr,"TADS",0x166);
  }
  prsgexp(ctx,ppVar1);
  ctx->prscxnode = ctx->prscxnrst;
  ctx->prscxnrem = ctx->prscxrrst;
  return;
}

Assistant:

void prsxgen_pia(prscxdef *ctx)
{
    prsndef *exprnode;

    /* parse the expression */
    exprnode = prsexpr(ctx);

    /* check for a possibly incorrect assignment if in C mode */
    if ((ctx->prscxtok->tokcxflg & TOKCXFCMODE)
        && exprnode && exprnode->prsntyp == TOKTASSIGN)
        errlog(ctx->prscxerr, ERR_PIA);

    /* generate the expression, and reset the parse node pool */
    prsgexp(ctx, exprnode);
    prsrstn(ctx);
}